

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

void testing::internal::ContainerPrinter::
     PrintValue<pstore::command_line::list<std::__cxx11::string,pstore::command_line::parser<std::__cxx11::string,void>>,void>
               (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::command_line::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
                *container,ostream *os)

{
  bool bVar1;
  long lVar2;
  _List_node_base *p_Var3;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  lVar2 = 0;
  p_Var3 = (_List_node_base *)&container->values_;
  do {
    p_Var3 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)&container->values_) break;
    if (lVar2 == 0) {
LAB_001325ae:
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
      PrintStringTo((string *)(p_Var3 + 1),os);
      lVar2 = lVar2 + 1;
      bVar1 = true;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1);
      if (lVar2 != 0x20) goto LAB_001325ae;
      std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
      lVar2 = 0x20;
      bVar1 = false;
    }
  } while (bVar1);
  if (lVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }